

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

void __thiscall raft_functional_common::TestMgr::save_config(TestMgr *this,cluster_config *config)

{
  __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDI;
  ptr<buffer> buf;
  shared_ptr<nuraft::cluster_config> *in_stack_ffffffffffffffa8;
  buffer *in_stack_ffffffffffffffc8;
  
  nuraft::cluster_config::serialize(config);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_RDI);
  nuraft::cluster_config::deserialize(in_stack_ffffffffffffffc8);
  std::shared_ptr<nuraft::cluster_config>::operator=
            ((shared_ptr<nuraft::cluster_config> *)in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x1fddf2);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1fddfc);
  return;
}

Assistant:

void save_config(const cluster_config& config) {
        ptr<buffer> buf = config.serialize();
        savedConfig = cluster_config::deserialize(*buf);
    }